

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>_>::write_decimal<unsigned_long_long>
          (basic_writer<fmt::v6::buffer_range<wchar_t>_> *this,unsigned_long_long value)

{
  bool bVar1;
  checked_ptr<typename_buffer<wchar_t>::value_type> pwVar2;
  unsigned_long_long in_RSI;
  size_t in_RDI;
  checked_ptr<typename_buffer<wchar_t>::value_type> *it;
  int num_digits;
  bool negative;
  uint32_or_64_or_128_t<unsigned_long_long> abs_value;
  basic_writer<fmt::v6::buffer_range<wchar_t>_> *in_stack_ffffffffffffffd0;
  checked_ptr<typename_buffer<wchar_t>::value_type> out;
  uint64_t local_18;
  
  bVar1 = is_negative<unsigned_long_long,_0>(in_RSI);
  local_18 = in_RSI;
  if (bVar1) {
    local_18 = (in_RSI ^ 0xffffffffffffffff) + 1;
  }
  count_digits(local_18);
  pwVar2 = reserve(in_stack_ffffffffffffffd0,in_RDI);
  out = pwVar2;
  if (bVar1) {
    out = pwVar2 + 1;
    *pwVar2 = L'-';
  }
  format_decimal<wchar_t,wchar_t*,unsigned_long>(out,in_RDI,0);
  return;
}

Assistant:

void write_decimal(Int value) {
    auto abs_value = static_cast<uint32_or_64_or_128_t<Int>>(value);
    bool negative = is_negative(value);
    // Don't do -abs_value since it trips unsigned-integer-overflow sanitizer.
    if (negative) abs_value = ~abs_value + 1;
    int num_digits = count_digits(abs_value);
    auto&& it = reserve((negative ? 1 : 0) + static_cast<size_t>(num_digits));
    if (negative) *it++ = static_cast<char_type>('-');
    it = format_decimal<char_type>(it, abs_value, num_digits);
  }